

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeFragments
          (VertexVaryingShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  long lVar3;
  int fragNdx;
  int iVar4;
  int iVar5;
  ulong uVar6;
  FragmentPacket *pFVar7;
  deUint32 local_98;
  deUint32 local_94;
  deUint32 local_90;
  deUint32 local_8c;
  FragmentPacket *local_88;
  ulong local_80;
  VertexVaryingShader *local_78;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vector<float,_4> local_58;
  rr local_40 [16];
  
  uVar6 = 0;
  local_70 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_70 = uVar6;
  }
  local_88 = packets;
  local_78 = this;
  for (local_80 = 0; local_80 != local_70; local_80 = local_80 + 1) {
    iVar4 = local_78->m_geometryOut;
    iVar5 = (int)uVar6;
    if (iVar4 == 0) {
      pGVar1 = context->outputArray;
      iVar4 = context->numFragmentOutputs;
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        *(undefined8 *)&pGVar1[(int)(((uint)lVar3 | (int)local_80 * 4) * iVar4)].v = 0x3f800000;
        *(undefined8 *)((long)&pGVar1[(int)(((uint)lVar3 | (int)local_80 * 4) * iVar4)].v + 8) =
             0x3f80000000000000;
      }
    }
    else if (iVar4 == 1) {
      pFVar7 = local_88 + local_80;
      for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
        rr::readTriangleVarying<float>((rr *)&local_98,pFVar7,context,0,iVar4);
        iVar2 = (iVar5 + iVar4) * context->numFragmentOutputs;
        pGVar1 = context->outputArray;
        pGVar1[iVar2].v.uData[0] = local_98;
        pGVar1[iVar2].v.uData[1] = local_94;
        pGVar1[iVar2].v.uData[2] = local_90;
        pGVar1[iVar2].v.uData[3] = local_8c;
      }
    }
    else if (iVar4 == 2) {
      pFVar7 = local_88 + local_80;
      for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
        rr::readTriangleVarying<float>(local_40,pFVar7,context,0,iVar4);
        rr::readTriangleVarying<float>((rr *)&local_68,pFVar7,context,1,iVar4);
        local_58.m_data[0] = fStack_64;
        local_58.m_data[1] = local_68;
        local_58.m_data[2] = fStack_60;
        local_58.m_data[3] = fStack_5c;
        tcu::operator+((tcu *)&local_98,(Vector<float,_4> *)local_40,&local_58);
        iVar2 = (iVar5 + iVar4) * context->numFragmentOutputs;
        pGVar1 = context->outputArray;
        pGVar1[iVar2].v.uData[0] = local_98;
        pGVar1[iVar2].v.uData[1] = local_94;
        pGVar1[iVar2].v.uData[2] = local_90;
        pGVar1[iVar2].v.uData[3] = local_8c;
      }
    }
    uVar6 = (ulong)(iVar5 + 4);
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		switch (m_geometryOut)
		{
			case 0:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
				break;

			case 1:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx));
				break;

			case 2:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0,   rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx)
					                                                        + rr::readTriangleVarying<float>(packets[packetNdx], context, 1, fragNdx).swizzle(1, 0, 2, 3));
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}